

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.cpp
# Opt level: O0

int main(void)

{
  variant<int,_float,_double> ele;
  variant<int,_float,_double> ele_00;
  variant<int,_float,_double> ele_01;
  int iVar1;
  ostream *this;
  heterovector hetvec;
  _Variadic_union<int,_float,_double> in_stack_ffffffffffffff78;
  variant<int,_float,_double> *this_00;
  variant<int,_float,_double> local_20;
  int local_4;
  
  local_4 = 0;
  this_00 = &local_20;
  heterovector::heterovector((heterovector *)0x101471);
  std::variant<int,float,double>::variant<double,void,void,double,void>
            (this_00,(double *)in_stack_ffffffffffffff78);
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = this_00;
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Uninitialized<int,_true>)(_Uninitialized<int,_true>)in_stack_ffffffffffffff78;
  heterovector::append((heterovector *)0x1014a2,ele);
  std::variant<int,float,double>::variant<int,void,void,int,void>
            (this_00,(int *)in_stack_ffffffffffffff78);
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = this_00;
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Uninitialized<int,_true>)(_Uninitialized<int,_true>)in_stack_ffffffffffffff78;
  heterovector::append((heterovector *)0x1014ce,ele_00);
  std::variant<int,float,double>::variant<int,void,void,int,void>
            (this_00,(int *)in_stack_ffffffffffffff78);
  ele_01.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = this_00;
  ele_01.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Uninitialized<int,_true>)(_Uninitialized<int,_true>)in_stack_ffffffffffffff78;
  heterovector::append((heterovector *)0x1014fa,ele_01);
  iVar1 = heterovector::size((heterovector *)0x101506);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  local_4 = 0;
  heterovector::~heterovector((heterovector *)0x101541);
  return local_4;
}

Assistant:

int main() {
    heterovector hetvec;

    hetvec.append(3.1);
    hetvec.append(1);
    hetvec.append(0);

    std::cout << hetvec.size() << std::endl;

    return 0;
}